

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O3

void __thiscall
dgPolyhedra::OptimizeTriangulation(dgPolyhedra *this,HaF64 *vertex,HaI32 strideInBytes)

{
  dgTreeNode *pdVar1;
  ulong uVar2;
  dgRedBackNode *pdVar3;
  int iVar4;
  ulong uVar5;
  Iterator iter;
  dgPolyhedra flatFace;
  dgPolyhedra buildConvex;
  dgPolyhedra leftOver;
  HaI32 polygon [8192];
  Iterator local_80d8;
  dgPolyhedra *local_80c8;
  Iterator local_80c0;
  dgPolyhedra local_80b0;
  dgPolyhedra local_8088;
  dgPolyhedra local_8060;
  HaI32 local_8038 [8194];
  
  dgPolyhedra(&local_8060);
  dgPolyhedra(&local_8088);
  pdVar1 = (this->super_dgTree<dgEdge,_long>).m_head;
  local_80d8.m_tree = &this->super_dgTree<dgEdge,_long>;
  local_80c8 = this;
  if (pdVar1 == (dgTreeNode *)0x0) {
    local_80d8.m_ptr = (dgRedBackNode *)0x0;
  }
  else {
    local_80d8.m_ptr = dgRedBackNode::Minimum(&pdVar1->super_dgRedBackNode);
    if (local_80d8.m_ptr != (dgRedBackNode *)0x0) {
      do {
        pdVar3 = local_80d8.m_ptr;
        dgTree<dgEdge,_long>::Iterator::operator++(&local_80d8,0);
        if (0 < *(int *)((long)&pdVar3[1]._vptr_dgRedBackNode + 4)) {
          dgPolyhedra(&local_80b0);
          MarkAdjacentCoplanarFaces
                    (local_80c8,&local_80b0,(dgEdge *)(pdVar3 + 1),vertex,strideInBytes);
          if (local_80b0.super_dgTree<dgEdge,_long>.m_count != 0) {
            RefineTriangulation(&local_80b0,vertex,strideInBytes >> 3);
            iVar4 = local_80b0.m_edgeMark + 1;
            local_80b0.m_edgeMark = iVar4;
            if (iVar4 == 0x7fffffff) {
              __assert_fail("m_edgeMark < 0x7fffffff",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.h"
                            ,0xe5,"hacd::HaI32 dgPolyhedra::IncLRU() const");
            }
            local_80c0.m_ptr = (dgRedBackNode *)0x0;
            local_80c0.m_tree = &local_80b0.super_dgTree<dgEdge,_long>;
            if (local_80b0.super_dgTree<dgEdge,_long>.m_head == (dgTreeNode *)0x0) {
              local_80c0.m_ptr = (dgRedBackNode *)0x0;
            }
            else {
              local_80c0.m_ptr =
                   dgRedBackNode::Minimum
                             (&(local_80b0.super_dgTree<dgEdge,_long>.m_head)->super_dgRedBackNode);
            }
            while (local_80c0.m_ptr != (dgRedBackNode *)0x0) {
              if ((*(int *)&local_80c0.m_ptr[2]._vptr_dgRedBackNode != iVar4) &&
                 (0 < *(int *)((long)&local_80c0.m_ptr[1]._vptr_dgRedBackNode + 4))) {
                pdVar3 = local_80c0.m_ptr + 1;
                uVar2 = 0;
                do {
                  uVar5 = uVar2;
                  local_8038[uVar5] = *(HaI32 *)&pdVar3->_vptr_dgRedBackNode;
                  if (uVar5 == 0x1fff) {
                    __assert_fail("vertexCount < hacd::HaI32 (sizeof (polygon) / sizeof (polygon[0]))"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                  ,0xd60,
                                  "void dgPolyhedra::OptimizeTriangulation(const hacd::HaF64 *const, hacd::HaI32)"
                                 );
                  }
                  *(int *)&pdVar3[1]._vptr_dgRedBackNode = iVar4;
                  pdVar3 = pdVar3->m_right;
                  uVar2 = uVar5 + 1;
                } while (pdVar3 != local_80c0.m_ptr + 1);
                if (1 < uVar5) {
                  AddFace(&local_8088,(HaI32)(uVar5 + 1),local_8038,(HaI64 *)0x0);
                }
              }
              dgTree<dgEdge,_long>::Iterator::operator++(&local_80c0,0);
            }
          }
          pdVar1 = ((dgTree<dgEdge,_long> *)&(local_80d8.m_tree)->_vptr_dgTree)->m_head;
          if (pdVar1 == (dgTreeNode *)0x0) {
            local_80d8.m_ptr = (dgRedBackNode *)0x0;
          }
          else {
            local_80d8.m_ptr = dgRedBackNode::Minimum(&pdVar1->super_dgRedBackNode);
          }
          ~dgPolyhedra(&local_80b0);
        }
      } while (local_80d8.m_ptr != (dgRedBackNode *)0x0);
    }
  }
  EndFace(&local_8088);
  if ((local_80c8->super_dgTree<dgEdge,_long>).m_count != 0) {
    __assert_fail("GetCount() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                  ,0xd6f,
                  "void dgPolyhedra::OptimizeTriangulation(const hacd::HaF64 *const, hacd::HaI32)");
  }
  pdVar1 = (local_80c8->super_dgTree<dgEdge,_long>).m_head;
  (local_80c8->super_dgTree<dgEdge,_long>).m_head = local_8088.super_dgTree<dgEdge,_long>.m_head;
  (local_80c8->super_dgTree<dgEdge,_long>).m_count = local_8088.super_dgTree<dgEdge,_long>.m_count;
  local_8088.super_dgTree<dgEdge,_long>.m_count = 0;
  local_8088.super_dgTree<dgEdge,_long>.m_head = pdVar1;
  ~dgPolyhedra(&local_8088);
  ~dgPolyhedra(&local_8060);
  return;
}

Assistant:

void dgPolyhedra::OptimizeTriangulation (const hacd::HaF64* const vertex, hacd::HaI32 strideInBytes)
{
	hacd::HaI32 polygon[1024 * 8];
	hacd::HaI32 stride = hacd::HaI32 (strideInBytes / sizeof (hacd::HaF64));

	dgPolyhedra leftOver;
	dgPolyhedra buildConvex;

	buildConvex.BeginFace();
	dgPolyhedra::Iterator iter (*this);

	for (iter.Begin(); iter; ) {
		dgEdge* const edge = &(*iter);
		iter++;

		if (edge->m_incidentFace > 0) {
			dgPolyhedra flatFace;
			MarkAdjacentCoplanarFaces (flatFace, edge, vertex, strideInBytes);
			//HACD_ASSERT (flatFace.GetCount());

			if (flatFace.GetCount()) {
				//flatFace.Triangulate (vertex, strideInBytes, &leftOver);
				//HACD_ASSERT (!leftOver.GetCount());
				flatFace.RefineTriangulation (vertex, stride);

				hacd::HaI32 mark = flatFace.IncLRU();
				dgPolyhedra::Iterator iter (flatFace);
				for (iter.Begin(); iter; iter ++) {
					dgEdge* const edge = &(*iter);
					if (edge->m_mark != mark) {
						if (edge->m_incidentFace > 0) {
							dgEdge* ptr = edge;
							hacd::HaI32 vertexCount = 0;
							do {
								polygon[vertexCount] = ptr->m_incidentVertex;				
								vertexCount ++;
								HACD_ASSERT (vertexCount < hacd::HaI32 (sizeof (polygon) / sizeof (polygon[0])));
								ptr->m_mark = mark;
								ptr = ptr->m_next;
							} while (ptr != edge);
							if (vertexCount >= 3) {
								buildConvex.AddFace (vertexCount, polygon);
							}
						}
					}
				}
			}
			iter.Begin();
		}
	}
	buildConvex.EndFace();
	HACD_ASSERT (GetCount() == 0);
	SwapInfo(buildConvex);
}